

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::createSelectionSets
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&_Stack_28,&this->nObjects);
  SelectionSet::SelectionSet(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&_Stack_28)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::createSelectionSets() {
    SelectionSet ss(nObjects);
    return ss;
  }